

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall wasm::Builder::dropIfConcretelyTyped(Builder *this,Expression *curr)

{
  Drop *this_00;
  
  this_00 = (Drop *)curr;
  if (1 < (curr->type).id) {
    this_00 = (Drop *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    this_00->value = curr;
    Drop::finalize(this_00);
  }
  return (Expression *)this_00;
}

Assistant:

Expression* dropIfConcretelyTyped(Expression* curr) {
    if (!curr->type.isConcrete()) {
      return curr;
    }
    return makeDrop(curr);
  }